

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

int AlpnSelectCallback(SSL *ssl,uint8_t **out,uint8_t *outlen,uint8_t *in,uint inlen,void *arg)

{
  size_t __n;
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  TestState *pTVar4;
  void *pvVar5;
  undefined8 *puVar6;
  
  pTVar4 = GetTestState(ssl);
  if (pTVar4->alpn_select_done == true) {
LAB_00125ef2:
    AlpnSelectCallback();
  }
  else {
    pTVar4 = GetTestState(ssl);
    pTVar4->alpn_select_done = true;
    iVar3 = TestConfigExDataIndex();
    pvVar5 = SSL_get_ex_data((SSL *)ssl,iVar3);
    if (*(char *)((long)pvVar5 + 0x360) != '\0') {
      return 3;
    }
    if (*(char *)((long)pvVar5 + 0x361) != '\0') {
      return 2;
    }
    __n = *(size_t *)((long)pvVar5 + 0x328);
    if ((__n == 0) ||
       ((__n == inlen && (iVar3 = bcmp(*(void **)((long)pvVar5 + 800),in,__n), iVar3 == 0)))) {
      if (*(char *)((long)pvVar5 + 0x363) == '\x01') {
        puVar1 = *(undefined8 **)((long)pvVar5 + 0x370);
        for (puVar6 = *(undefined8 **)((long)pvVar5 + 0x368); puVar6 != puVar1; puVar6 = puVar6 + 8)
        {
          iVar3 = SSL_add_application_settings
                            (ssl,(uint8_t *)*puVar6,puVar6[1],(uint8_t *)puVar6[4],puVar6[5]);
          if (iVar3 == 0) {
            AlpnSelectCallback();
            goto LAB_00125ef2;
          }
        }
      }
      lVar2 = *(long *)((long)pvVar5 + 0x348);
      if ((lVar2 == 0) || (*(char *)((long)pvVar5 + 0x362) != '\x01')) {
        *out = *(uint8_t **)((long)pvVar5 + 0x340);
        *outlen = (uint8_t)lVar2;
        return 0;
      }
      goto LAB_00125efc;
    }
  }
  AlpnSelectCallback();
LAB_00125efc:
  __assert_fail("config->select_alpn.empty() || !config->select_empty_alpn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc"
                ,0x428,
                "int AlpnSelectCallback(SSL *, const uint8_t **, uint8_t *, const uint8_t *, unsigned int, void *)"
               );
}

Assistant:

static int AlpnSelectCallback(SSL *ssl, const uint8_t **out, uint8_t *outlen,
                              const uint8_t *in, unsigned inlen, void *arg) {
  if (GetTestState(ssl)->alpn_select_done) {
    fprintf(stderr, "AlpnSelectCallback called after completion.\n");
    exit(1);
  }

  GetTestState(ssl)->alpn_select_done = true;

  const TestConfig *config = GetTestConfig(ssl);
  if (config->decline_alpn) {
    return SSL_TLSEXT_ERR_NOACK;
  }
  if (config->reject_alpn) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }

  if (!config->expect_advertised_alpn.empty() &&
      bssl::StringAsBytes(config->expect_advertised_alpn) !=
          bssl::Span(in, inlen)) {
    fprintf(stderr, "bad ALPN select callback inputs.\n");
    exit(1);
  }

  if (config->defer_alps) {
    for (const auto &pair : config->application_settings) {
      if (!SSL_add_application_settings(
              ssl, reinterpret_cast<const uint8_t *>(pair.first.data()),
              pair.first.size(),
              reinterpret_cast<const uint8_t *>(pair.second.data()),
              pair.second.size())) {
        fprintf(stderr, "error configuring ALPS.\n");
        exit(1);
      }
    }
  }

  assert(config->select_alpn.empty() || !config->select_empty_alpn);
  *out = (const uint8_t *)config->select_alpn.data();
  *outlen = config->select_alpn.size();
  return SSL_TLSEXT_ERR_OK;
}